

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> __thiscall
wabt::
MakeUnique<wabt::WastLexer,std::unique_ptr<wabt::LexerSource,std::default_delete<wabt::LexerSource>>,wabt::string_view&>
          (wabt *this,unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *args,
          string_view *args_1)

{
  WastLexer *this_00;
  unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> local_28;
  string_view *local_20;
  string_view *args_local_1;
  unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *args_local;
  
  local_20 = args_1;
  args_local_1 = (string_view *)args;
  args_local = (unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *)this;
  this_00 = (WastLexer *)operator_new(0x58);
  std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::unique_ptr
            (&local_28,
             (unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *)args_local_1)
  ;
  WastLexer::WastLexer(this_00,&local_28,*local_20);
  std::unique_ptr<wabt::WastLexer,std::default_delete<wabt::WastLexer>>::
  unique_ptr<std::default_delete<wabt::WastLexer>,void>
            ((unique_ptr<wabt::WastLexer,std::default_delete<wabt::WastLexer>> *)this,this_00);
  std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::~unique_ptr
            (&local_28);
  return (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)
         (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}